

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.c
# Opt level: O1

int bc_order(void)

{
  obj *poVar1;
  
  if ((((uchain->ox == uball->ox) && (uchain->oy == uball->oy)) && (uball->where != '\x03')) &&
     ((u._1052_1_ & 1) == 0)) {
    for (poVar1 = level->objects[uball->ox][uball->oy]; poVar1 != (obj *)0x0;
        poVar1 = (poVar1->v).v_nexthere) {
      if (poVar1 == uchain) {
        return 1;
      }
      if (poVar1 == uball) {
        return 2;
      }
    }
    impossible("bc_order:  ball&chain not in same location!");
  }
  return 0;
}

Assistant:

static int bc_order(void)
{
    struct obj *obj;

    if (uchain->ox != uball->ox || uchain->oy != uball->oy || carried(uball)
		|| u.uswallow)
	return BCPOS_DIFFER;

    for (obj = level->objects[uball->ox][uball->oy]; obj; obj = obj->nexthere) {
	if (obj == uchain) return BCPOS_CHAIN;
	if (obj == uball) return BCPOS_BALL;
    }
    impossible("bc_order:  ball&chain not in same location!");
    return BCPOS_DIFFER;
}